

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

bool Am_Valid_and_Visible_List_Or_Object(Am_Value *value,bool want_visible)

{
  bool bVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Object *pAVar3;
  Am_Object obj;
  Am_Object o;
  Am_Value_List local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar1 = Am_Value::Valid(value);
  bVar2 = true;
  if (bVar1) {
    if (value->type == 0xa001) {
      local_68.data = (Am_Value_List_Data *)0x0;
      Am_Object::operator=((Am_Object *)&local_68,value);
      if (want_visible) {
        pAVar3 = &local_38;
        Am_Object::Am_Object(pAVar3,(Am_Object *)&local_68);
        bVar2 = Am_Object_And_Owners_Valid_And_Visible(pAVar3);
      }
      else {
        pAVar3 = &local_40;
        Am_Object::Am_Object(pAVar3,(Am_Object *)&local_68);
        bVar2 = Am_Object_Valid_And_Not_Part(pAVar3);
      }
      Am_Object::~Am_Object(pAVar3);
      Am_Object::~Am_Object((Am_Object *)&local_68);
    }
    else if ((value->type & 0x7000) == 0x2000) {
      bVar1 = Am_Value_List::Test((value->value).wrapper_value);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_68);
        Am_Value_List::operator=(&local_68,value);
        local_58.data = (Am_Object_Data *)0x0;
        Am_Value_List::Start(&local_68);
        while( true ) {
          bVar2 = Am_Value_List::Last(&local_68);
          if (bVar2) break;
          in_value = Am_Value_List::Get(&local_68);
          Am_Object::operator=(&local_58,in_value);
          if (want_visible) {
            Am_Object::Am_Object(&local_48,&local_58);
            pAVar3 = &local_48;
            bVar1 = Am_Object_And_Owners_Valid_And_Visible(pAVar3);
          }
          else {
            Am_Object::Am_Object(&local_50,&local_58);
            pAVar3 = &local_50;
            bVar1 = Am_Object_Valid_And_Not_Part(pAVar3);
          }
          Am_Object::~Am_Object(pAVar3);
          if (bVar1 == false) break;
          Am_Value_List::Next(&local_68);
        }
        Am_Object::~Am_Object(&local_58);
        Am_Value_List::~Am_Value_List(&local_68);
      }
    }
  }
  return bVar2;
}

Assistant:

bool
Am_Valid_and_Visible_List_Or_Object(Am_Value value, bool want_visible)
{
  if (!value.Valid())
    return true; //if no value, then OK
  if (value.type == Am_OBJECT) {
    Am_Object obj;
    obj = value;
    if (want_visible)
      return Am_Object_And_Owners_Valid_And_Visible(obj);
    else
      return Am_Object_Valid_And_Not_Part(obj);
  }
  //// BUG: Need to move add_ref to setter to avoid this annoyance
  else if (Am_Type_Class(value.type) == Am_WRAPPER &&
           Am_Value_List::Test(value.value.wrapper_value)) {
    // test each value and return true if all ok
    Am_Value_List l;
    l = value;
    Am_Object o;
    for (l.Start(); !l.Last(); l.Next()) {
      o = l.Get();
      if (want_visible) {
        if (!Am_Object_And_Owners_Valid_And_Visible(o))
          return false;
      } else //want it to be valid but invisible
          if (!Am_Object_Valid_And_Not_Part(o))
        return false;
    }
    return true; //all are ok
  } else
    return true; //slot does not contain an object
}